

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O3

int picnic_sign(picnic_privatekey_t *sk,uint8_t *message,size_t message_len,uint8_t *signature,
               size_t *signature_len)

{
  byte bVar1;
  int iVar2;
  picnic_instance_t *pp;
  ulong len;
  picnic_context_t context;
  picnic_context_t local_e0;
  
  iVar2 = -1;
  if (signature_len != (size_t *)0x0 &&
      (signature != (uint8_t *)0x0 && sk != (picnic_privatekey_t *)0x0)) {
    bVar1 = sk->data[0];
    pp = picnic_instance_get((uint)bVar1);
    if (pp != (picnic_instance_t *)0x0) {
      len = (ulong)pp->input_output_size;
      local_e0.private_key = sk->data + 1;
      local_e0.public_key = sk->data + len + 1;
      local_e0.plaintext = sk->data + len * 2 + 1;
      if ((byte)(bVar1 - 7) < 3) {
        iVar2 = impl_sign_picnic3(pp,local_e0.plaintext,local_e0.private_key,local_e0.public_key,
                                  message,message_len,signature,signature_len);
      }
      else {
        mzd_from_char_array(local_e0.m_plaintext,local_e0.plaintext,len);
        mzd_from_char_array(local_e0.m_key,local_e0.private_key,(ulong)pp->input_output_size);
        local_e0.unruh = SUB81(0x1000100010000 >> (((ulong)bVar1 & 7) << 3),0);
        if (6 < bVar1) {
          local_e0.unruh = false;
        }
        local_e0.msg = message;
        local_e0.msglen = message_len;
        iVar2 = picnic_impl_sign(pp,&local_e0,signature,signature_len);
        explicit_bzero(local_e0.m_key,0x20);
      }
    }
  }
  return iVar2;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_sign(const picnic_privatekey_t* sk, const uint8_t* message,
                                          size_t message_len, uint8_t* signature,
                                          size_t* signature_len) {
  if (!sk || !signature || !signature_len) {
    return -1;
  }

  const picnic_params_t param       = sk->data[0];
  const picnic_instance_t* instance = picnic_instance_get(param);
  if (!instance) {
    return -1;
  }

  const uint8_t* sk_sk = SK_SK(sk);
  const uint8_t* sk_c  = SK_C(sk, instance);
  const uint8_t* sk_pt = SK_PT(sk, instance);

  if (param == Picnic3_L1 || param == Picnic3_L3 || param == Picnic3_L5) {
#if defined(WITH_KKW)
    return impl_sign_picnic3(instance, sk_pt, sk_sk, sk_c, message, message_len, signature,
                             signature_len);
#else
    return -1;
#endif
  } else {
#if defined(WITH_ZKBPP)
    picnic_context_t context;
    mzd_from_char_array(context.m_plaintext, sk_pt, instance->input_output_size);
    mzd_from_char_array(context.m_key, sk_sk, instance->input_output_size);
    context.plaintext   = sk_pt;
    context.private_key = sk_sk;
    context.public_key  = sk_c;
    context.msg         = message;
    context.msglen      = message_len;
#if defined(WITH_UNRUH)
    context.unruh = picnic_instance_is_unruh(param);
#endif
    int ret = picnic_impl_sign(instance, &context, signature, signature_len);
    picnic_explicit_bzero(context.m_key, sizeof(context.m_key));
    return ret;
#else
    return -1;
#endif
  }
}